

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threading.cpp
# Opt level: O3

void __thiscall senjo::Mutex::Lock(Mutex *this)

{
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void Mutex::Lock()
{
#ifdef _WIN32
  if (mutex) {
    WaitForSingleObject(mutex, INFINITE);
  }
#else
  pthread_mutex_lock(&mutex);
#endif
}